

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O1

int png_image_read_header(png_voidp argument)

{
  png_structrp png_ptr;
  png_inforp info_ptr;
  png_uint_32 pVar1;
  uint uVar2;
  uint uVar3;
  
  png_ptr = (png_structrp)**argument;
  info_ptr = (png_inforp)(*argument)[1];
  png_set_benign_errors(png_ptr,1);
  png_read_info(png_ptr,info_ptr);
  *(png_uint_32 *)((long)argument + 0xc) = png_ptr->width;
  *(png_uint_32 *)((long)argument + 0x10) = png_ptr->height;
  pVar1 = png_image_format(png_ptr);
  *(png_uint_32 *)((long)argument + 0x14) = pVar1;
  if (((pVar1 & 2) != 0) && (((png_ptr->colorspace).flags & 0x8042) == 2)) {
    *(byte *)((long)argument + 0x18) = *(byte *)((long)argument + 0x18) | 1;
  }
  if (png_ptr->color_type == '\x03') {
    uVar2 = (uint)png_ptr->num_palette;
  }
  else {
    uVar2 = 0x100;
    if (png_ptr->color_type == '\0') {
      uVar2 = 1 << (png_ptr->bit_depth & 0x1f);
    }
  }
  uVar3 = 0x100;
  if (uVar2 < 0x100) {
    uVar3 = uVar2;
  }
  *(uint *)((long)argument + 0x1c) = uVar3;
  return 1;
}

Assistant:

static int
png_image_read_header(png_voidp argument)
{
   png_imagep image = png_voidcast(png_imagep, argument);
   png_structrp png_ptr = image->opaque->png_ptr;
   png_inforp info_ptr = image->opaque->info_ptr;

#ifdef PNG_BENIGN_ERRORS_SUPPORTED
   png_set_benign_errors(png_ptr, 1/*warn*/);
#endif
   png_read_info(png_ptr, info_ptr);

   /* Do this the fast way; just read directly out of png_struct. */
   image->width = png_ptr->width;
   image->height = png_ptr->height;

   {
      png_uint_32 format = png_image_format(png_ptr);

      image->format = format;

#ifdef PNG_COLORSPACE_SUPPORTED
      /* Does the colorspace match sRGB?  If there is no color endpoint
       * (colorant) information assume yes, otherwise require the
       * 'ENDPOINTS_MATCHP_sRGB' colorspace flag to have been set.  If the
       * colorspace has been determined to be invalid ignore it.
       */
      if ((format & PNG_FORMAT_FLAG_COLOR) != 0 && ((png_ptr->colorspace.flags
         & (PNG_COLORSPACE_HAVE_ENDPOINTS|PNG_COLORSPACE_ENDPOINTS_MATCH_sRGB|
            PNG_COLORSPACE_INVALID)) == PNG_COLORSPACE_HAVE_ENDPOINTS))
         image->flags |= PNG_IMAGE_FLAG_COLORSPACE_NOT_sRGB;
#endif
   }

   /* We need the maximum number of entries regardless of the format the
    * application sets here.
    */
   {
      png_uint_32 cmap_entries;

      switch (png_ptr->color_type)
      {
         case PNG_COLOR_TYPE_GRAY:
            cmap_entries = 1U << png_ptr->bit_depth;
            break;

         case PNG_COLOR_TYPE_PALETTE:
            cmap_entries = (png_uint_32)png_ptr->num_palette;
            break;

         default:
            cmap_entries = 256;
            break;
      }

      if (cmap_entries > 256)
         cmap_entries = 256;

      image->colormap_entries = cmap_entries;
   }

   return 1;
}